

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptUtils.cpp
# Opt level: O0

Variable * getVariableOrCrash(Object *object)

{
  int iVar1;
  runtime_error *prVar2;
  Variable *local_38;
  ObjectType type;
  Object *object_local;
  
  if (object == (Object *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"ScriptUtils::getVariableOrCrash => object is null!");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = (**object->_vptr_Object)();
  if ((char)iVar1 == '\x02') {
    if (object == (Object *)0x0) {
      local_38 = (Variable *)0x0;
    }
    else {
      local_38 = (Variable *)__dynamic_cast(object,&Object::typeinfo,&Variable::typeinfo,0);
    }
    return local_38;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"ScriptUtils::getVariableOrCrash => wrong type!");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Variable* getVariableOrCrash(Object* object) {
	if (object == nullptr) {
		throw std::runtime_error("ScriptUtils::getVariableOrCrash => object is null!");
	}
	ObjectType type = object->getType();
	if (type == OT_VARIABLE) {
		return dynamic_cast<Variable *>(object);
	} else {
		throw std::runtime_error("ScriptUtils::getVariableOrCrash => wrong type!");
	}
}